

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindDecimalAvg
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _func_int **pp_Var3;
  _Alloc_hider _Var4;
  size_type sVar5;
  byte bVar6;
  reference this_01;
  pointer pEVar7;
  reference pvVar8;
  undefined8 *puVar9;
  bool bVar10;
  hugeint_t input;
  LogicalType decimal_type;
  double result;
  LogicalType local_160;
  AggregateFunction local_148;
  
  this_01 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_01);
  LogicalType::LogicalType(&local_160,&pEVar7->return_type);
  GetAverageAggregate(&local_148,local_160.physical_type_);
  AggregateFunction::operator=(function,&local_148);
  local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02477a08;
  if (local_148.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_148.super_BaseScalarFunction);
  ::std::__cxx11::string::_M_replace
            ((ulong)&(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name,0
             ,(char *)(function->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
                      _M_string_length,0x1e39006);
  pvVar8 = vector<duckdb::LogicalType,_true>::operator[]
                     (&(function->super_BaseScalarFunction).super_SimpleFunction.arguments,0);
  if (pvVar8 != &local_160) {
    pvVar8->id_ = local_160.id_;
    pvVar8->physical_type_ = local_160.physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=(&pvVar8->type_info_,&local_160.type_info_);
  }
  LogicalType::LogicalType((LogicalType *)&local_148,DOUBLE);
  sVar5 = local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
          _M_string_length;
  _Var4._M_p = local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
               _M_dataplus._M_p;
  (function->super_BaseScalarFunction).return_type.id_ =
       (LogicalTypeId)
       local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function;
  (function->super_BaseScalarFunction).return_type.physical_type_ =
       local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function._1_1_;
  peVar2 = (function->super_BaseScalarFunction).return_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (function->super_BaseScalarFunction).return_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (function->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (function->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_dataplus._M_p =
       (pointer)0x0;
  local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_string_length = 0;
  this_00 = (function->super_BaseScalarFunction).return_type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (function->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var4._M_p;
  (function->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  sVar5 = local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
          _M_string_length;
  bVar10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.
           _M_string_length != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_dataplus._M_p =
       (pointer)peVar2;
  local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function.name._M_string_length =
       (size_type)p_Var1;
  if (bVar10) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5);
  }
  LogicalType::~LogicalType((LogicalType *)&local_148);
  bVar6 = DecimalType::GetScale(&local_160);
  local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)0x0;
  input.upper = (int64_t)&local_148;
  input.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + (ulong)bVar6 * 0x10 + 8);
  Hugeint::TryCast<double>
            (*(Hugeint **)(Hugeint::POWERS_OF_TEN + (ulong)bVar6 * 0x10),input,
             (double *)Hugeint::POWERS_OF_TEN);
  pp_Var3 = local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function;
  puVar9 = (undefined8 *)operator_new(0x10);
  *puVar9 = &PTR__FunctionData_024b4d20;
  puVar9[1] = pp_Var3;
  *(undefined8 **)this = puVar9;
  LogicalType::~LogicalType(&local_160);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> BindDecimalAvg(ClientContext &context, AggregateFunction &function,
                                        vector<unique_ptr<Expression>> &arguments) {
	auto decimal_type = arguments[0]->return_type;
	function = GetAverageAggregate(decimal_type.InternalType());
	function.name = "avg";
	function.arguments[0] = decimal_type;
	function.return_type = LogicalType::DOUBLE;
	return make_uniq<AverageDecimalBindData>(
	    Hugeint::Cast<double>(Hugeint::POWERS_OF_TEN[DecimalType::GetScale(decimal_type)]));
}